

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O1

NonStandardLayout * __thiscall
phmap::priv::hash_internal::Generator<phmap::priv::NonStandardLayout,_void>::operator()
          (NonStandardLayout *__return_storage_ptr__,
          Generator<phmap::priv::NonStandardLayout,_void> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_31;
  string local_30;
  
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_30,&local_31);
  __return_storage_ptr__->_vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_0034b120;
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == &local_30.field_2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,local_30.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = local_30.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->value)._M_dataplus._M_p = local_30._M_dataplus._M_p;
    (__return_storage_ptr__->value).field_2._M_allocated_capacity =
         CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,local_30.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->value)._M_string_length = local_30._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

NonStandardLayout operator()() const {
        return NonStandardLayout(Generator<std::string>()());
    }